

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSavepoint(Pager *pPager,int op,int iSavepoint)

{
  PagerSavepoint *pPVar1;
  int iVar2;
  int iVar3;
  PagerSavepoint *local_48;
  PagerSavepoint *pSavepoint;
  i64 sz;
  PagerSavepoint *pRel;
  int local_20;
  int nNew;
  int ii;
  int rc;
  int iSavepoint_local;
  int op_local;
  Pager *pPager_local;
  
  nNew = pPager->errCode;
  if ((nNew == 0) && (iSavepoint < pPager->nSavepoint)) {
    iVar2 = iSavepoint + (uint)(op != 1);
    for (local_20 = iVar2; local_20 < pPager->nSavepoint; local_20 = local_20 + 1) {
      sqlite3BitvecDestroy(pPager->aSavepoint[local_20].pInSavepoint);
    }
    pPager->nSavepoint = iVar2;
    if (op == 1) {
      pPVar1 = pPager->aSavepoint;
      if ((pPVar1[iVar2].bTruncateOnRelease != 0) &&
         (pPager->sjfd->pMethods != (sqlite3_io_methods *)0x0)) {
        iVar3 = sqlite3JournalIsInMemory(pPager->sjfd);
        if (iVar3 != 0) {
          nNew = sqlite3OsTruncate(pPager->sjfd,
                                   (pPager->pageSize + 4) * (ulong)pPVar1[iVar2].iSubRec);
        }
        pPager->nSubRec = pPVar1[iVar2].iSubRec;
      }
    }
    else if ((pPager->pWal != (Wal *)0x0) || (pPager->jfd->pMethods != (sqlite3_io_methods *)0x0)) {
      if (iVar2 == 0) {
        local_48 = (PagerSavepoint *)0x0;
      }
      else {
        local_48 = pPager->aSavepoint + (iVar2 + -1);
      }
      nNew = pagerPlaybackSavepoint(pPager,local_48);
    }
  }
  return nNew;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSavepoint(Pager *pPager, int op, int iSavepoint){
  int rc = pPager->errCode;

#ifdef SQLITE_ENABLE_ZIPVFS
  if( op==SAVEPOINT_RELEASE ) rc = SQLITE_OK;
#endif

  assert( op==SAVEPOINT_RELEASE || op==SAVEPOINT_ROLLBACK );
  assert( iSavepoint>=0 || op==SAVEPOINT_ROLLBACK );

  if( rc==SQLITE_OK && iSavepoint<pPager->nSavepoint ){
    int ii;            /* Iterator variable */
    int nNew;          /* Number of remaining savepoints after this op. */

    /* Figure out how many savepoints will still be active after this
    ** operation. Store this value in nNew. Then free resources associated
    ** with any savepoints that are destroyed by this operation.
    */
    nNew = iSavepoint + (( op==SAVEPOINT_RELEASE ) ? 0 : 1);
    for(ii=nNew; ii<pPager->nSavepoint; ii++){
      sqlite3BitvecDestroy(pPager->aSavepoint[ii].pInSavepoint);
    }
    pPager->nSavepoint = nNew;

    /* Truncate the sub-journal so that it only includes the parts
    ** that are still in use. */
    if( op==SAVEPOINT_RELEASE ){
      PagerSavepoint *pRel = &pPager->aSavepoint[nNew];
      if( pRel->bTruncateOnRelease && isOpen(pPager->sjfd) ){
        /* Only truncate if it is an in-memory sub-journal. */
        if( sqlite3JournalIsInMemory(pPager->sjfd) ){
          i64 sz = (pPager->pageSize+4)*(i64)pRel->iSubRec;
          rc = sqlite3OsTruncate(pPager->sjfd, sz);
          assert( rc==SQLITE_OK );
        }
        pPager->nSubRec = pRel->iSubRec;
      }
    }
    /* Else this is a rollback operation, playback the specified savepoint.
    ** If this is a temp-file, it is possible that the journal file has
    ** not yet been opened. In this case there have been no changes to
    ** the database file, so the playback operation can be skipped.
    */
    else if( pagerUseWal(pPager) || isOpen(pPager->jfd) ){
      PagerSavepoint *pSavepoint = (nNew==0)?0:&pPager->aSavepoint[nNew-1];
      rc = pagerPlaybackSavepoint(pPager, pSavepoint);
      assert(rc!=SQLITE_DONE);
    }

#ifdef SQLITE_ENABLE_ZIPVFS
    /* If the cache has been modified but the savepoint cannot be rolled
    ** back journal_mode=off, put the pager in the error state. This way,
    ** if the VFS used by this pager includes ZipVFS, the entire transaction
    ** can be rolled back at the ZipVFS level.  */
    else if(
        pPager->journalMode==PAGER_JOURNALMODE_OFF
     && pPager->eState>=PAGER_WRITER_CACHEMOD
    ){
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      setGetterMethod(pPager);
    }
#endif
  }

  return rc;
}